

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_5.cpp
# Opt level: O3

bool __thiscall Date::is_valid(Date *this)

{
  uint uVar1;
  Month MVar2;
  uint uVar3;
  
  uVar1 = this->y;
  if ((int)uVar1 < 1) {
    return false;
  }
  MVar2 = this->m;
  uVar3 = this->d;
  if ((int)uVar3 < 1 || 0xb < MVar2 - jan) {
    return false;
  }
  if (MVar2 < dec) {
    if ((0xa50U >> (MVar2 & 0x1f) & 1) != 0) {
      if (uVar3 < 0x1f) {
        return true;
      }
      goto LAB_00102565;
    }
    if (MVar2 != feb) goto LAB_00102522;
    if ((uVar1 & 3) != 0) goto LAB_00102565;
  }
  else {
LAB_00102522:
    if (uVar3 < 0x20) {
      return true;
    }
    if ((uVar1 & 3) != 0 || MVar2 != feb) goto LAB_00102565;
  }
  if ((0x28f5c28 < (uVar1 * -0x3d70a3d7 >> 2 | uVar1 * 0x40000000) ||
      (uVar1 * -0x3d70a3d7 >> 4 | uVar1 * -0x70000000) < 0xa3d70b) && uVar3 < 0x1e) {
    return true;
  }
LAB_00102565:
  return uVar3 < 0x1d;
}

Assistant:

bool Date::is_valid()
{
	bool is_valid = y > 0 && (int(m) > 0 && int(m) < 13) && d > 0;
	is_valid = is_valid && (
		(is_31_day_month(m) && d < 32) ||
		(is_30_day_month(m) && d < 31) ||
		(m == Month::feb && (is_leap(y) && d < 30) || d < 29)
		);
	return is_valid;
}